

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjCompress2(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
               uchar **jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  char *pcVar5;
  unsigned_long uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 uVar11;
  
  if (handle == (tjhandle)0x0) {
    puVar4 = (undefined8 *)__tls_get_addr(&PTR_00199f20);
    *(undefined8 *)((long)puVar4 + 7) = 0x656c646e616820;
    *puVar4 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjCompress2(): Instance has not been initialized for compression",0x41);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar3 = (void *)__tls_get_addr(&PTR_00199f20);
    memcpy(pvVar3,"tjCompress2(): Instance has not been initialized for compression",0x41);
  }
  else {
    if ((((uint)jpegSubsamp < 6 && jpegSize != (unsigned_long *)0x0) &&
        (jpegBuf != (uchar **)0x0 &&
        ((uint)pixelFormat < 0xc &&
        ((0 < height && srcBuf != (uchar *)0x0) && (-1 < pitch && 0 < width))))) &&
        (uint)jpegQual < 0x65) {
      if (pitch == 0) {
        pitch = tjPixelSize[(uint)pixelFormat] * width;
      }
      pvVar3 = malloc((ulong)(uint)height * 8);
      if (pvVar3 != (void *)0x0) {
        iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar1 != 0) {
          uVar2 = 0xffffffff;
          cVar8 = '\0';
          goto LAB_00132cde;
        }
        *(int *)((long)handle + 0x30) = width;
        *(int *)((long)handle + 0x34) = height;
        if ((flags & 8U) == 0) {
          if ((flags & 0x10U) != 0) {
            pcVar5 = "JSIMD_FORCESSE=1";
            goto LAB_00132d5e;
          }
          if ((flags & 0x20U) != 0) {
            pcVar5 = "JSIMD_FORCESSE2=1";
            goto LAB_00132d5e;
          }
        }
        else {
          pcVar5 = "JSIMD_FORCEMMX=1";
LAB_00132d5e:
          putenv(pcVar5);
        }
        uVar2 = flags & 0x400;
        if (uVar2 != 0) {
          uVar6 = tjBufSize(width,height,jpegSubsamp);
          *jpegSize = uVar6;
        }
        cVar8 = (char)(uVar2 >> 10);
        jpeg_mem_dest_tj((j_compress_ptr)handle,jpegBuf,jpegSize,(uint)(uVar2 == 0));
        setCompDefaults((jpeg_compress_struct *)handle,pixelFormat,jpegSubsamp,jpegQual,flags);
        jpeg_start_compress((j_compress_ptr)handle,1);
        uVar7 = (ulong)(uint)height;
        for (uVar9 = 0; uVar7 = uVar7 - 1, uVar9 != (uint)height; uVar9 = uVar9 + 1) {
          uVar10 = uVar7;
          if ((flags & 2U) == 0) {
            uVar10 = uVar9;
          }
          *(uchar **)((long)pvVar3 + uVar9 * 8) = srcBuf + uVar10 * (long)pitch;
        }
        while( true ) {
          uVar2 = *(uint *)((long)handle + 0x130);
          if (*(uint *)((long)handle + 0x34) <= uVar2) break;
          jpeg_write_scanlines
                    ((j_compress_ptr)handle,(JSAMPARRAY)((long)pvVar3 + (ulong)uVar2 * 8),
                     *(uint *)((long)handle + 0x34) - uVar2);
        }
        jpeg_finish_compress((j_compress_ptr)handle);
        uVar2 = 0;
        goto LAB_00132cde;
      }
      builtin_strncpy((char *)((long)handle + 0x621),"ocation ",8);
      builtin_strncpy((char *)((long)handle + 0x629),"failure",8);
      builtin_strncpy((char *)((long)handle + 0x618),"emory al",8);
      builtin_strncpy((char *)((long)handle + 0x620),"location",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ss2(",4);
      builtin_strncpy((char *)((long)handle + 0x614),"): M",4);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pcVar5 = (char *)__tls_get_addr(&PTR_00199f20);
      builtin_strncpy(pcVar5 + 0x10,"emory allocation failure",0x19);
      uVar11._0_1_ = ')';
      uVar11._1_1_ = ':';
      uVar11._2_1_ = ' ';
      uVar11._3_1_ = 'M';
    }
    else {
      builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
      builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ss2(",4);
      builtin_strncpy((char *)((long)handle + 0x614),"): I",4);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pcVar5 = (char *)__tls_get_addr(&PTR_00199f20);
      builtin_strncpy(pcVar5 + 0x10,"nvalid argument",0x10);
      uVar11._0_1_ = ')';
      uVar11._1_1_ = ':';
      uVar11._2_1_ = ' ';
      uVar11._3_1_ = 'I';
    }
    pcVar5[0] = 't';
    pcVar5[1] = 'j';
    pcVar5[2] = 'C';
    pcVar5[3] = 'o';
    pcVar5[4] = 'm';
    pcVar5[5] = 'p';
    pcVar5[6] = 'r';
    pcVar5[7] = 'e';
    pcVar5[8] = 's';
    pcVar5[9] = 's';
    pcVar5[10] = '2';
    pcVar5[0xb] = '(';
    *(undefined4 *)(pcVar5 + 0xc) = uVar11;
  }
  uVar2 = 0xffffffff;
  pvVar3 = (void *)0x0;
  cVar8 = '\0';
LAB_00132cde:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (cVar8 == '\0') {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  free(pvVar3);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar2;
}

Assistant:

DLLEXPORT int tjCompress2(tjhandle handle, const unsigned char *srcBuf,
                          int width, int pitch, int height, int pixelFormat,
                          unsigned char **jpegBuf, unsigned long *jpegSize,
                          int jpegSubsamp, int jpegQual, int flags)
{
  int i, retval = 0, alloc = 1;
  JSAMPROW *row_pointer = NULL;

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0)
    THROW("tjCompress2(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || jpegBuf == NULL ||
      jpegSize == NULL || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT ||
      jpegQual < 0 || jpegQual > 100)
    THROW("tjCompress2(): Invalid argument");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * height)) == NULL)
    THROW("tjCompress2(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, jpegSubsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, pixelFormat, jpegSubsamp, jpegQual, flags);

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  while (cinfo->next_scanline < cinfo->image_height)
    jpeg_write_scanlines(cinfo, &row_pointer[cinfo->next_scanline],
                         cinfo->image_height - cinfo->next_scanline);
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}